

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O1

common_chat_tool_choice common_chat_tool_choice_parse_oaicompat(string *tool_choice)

{
  int iVar1;
  common_chat_tool_choice cVar2;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  iVar1 = std::__cxx11::string::compare((char *)tool_choice);
  if (iVar1 == 0) {
    cVar2 = COMMON_CHAT_TOOL_CHOICE_AUTO;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)tool_choice);
    if (iVar1 == 0) {
      cVar2 = COMMON_CHAT_TOOL_CHOICE_NONE;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)tool_choice);
      cVar2 = COMMON_CHAT_TOOL_CHOICE_REQUIRED;
      if (iVar1 != 0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&bStack_38,"Invalid tool_choice: ",tool_choice);
        std::runtime_error::runtime_error(this,(string *)&bStack_38);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  return cVar2;
}

Assistant:

common_chat_tool_choice common_chat_tool_choice_parse_oaicompat(const std::string & tool_choice) {
    if (tool_choice == "auto") {
        return COMMON_CHAT_TOOL_CHOICE_AUTO;
    }
    if (tool_choice == "none") {
        return COMMON_CHAT_TOOL_CHOICE_NONE;
    }
    if (tool_choice == "required") {
        return COMMON_CHAT_TOOL_CHOICE_REQUIRED;
    }
    throw std::runtime_error("Invalid tool_choice: " + tool_choice);
}